

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O3

void dradf4(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2,float *wa3)

{
  ulong uVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  int iVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  int local_80;
  
  iVar3 = l1 * ido;
  if (0 < l1) {
    iVar10 = 0;
    pfVar2 = cc;
    iVar12 = 0;
    iVar7 = l1;
    do {
      fVar14 = pfVar2[iVar3];
      fVar15 = pfVar2[iVar3 * 3];
      fVar18 = cc[iVar10];
      fVar21 = pfVar2[iVar3 * 2];
      ch[iVar12] = fVar14 + fVar15 + fVar18 + fVar21;
      iVar13 = ido * 4 + iVar12;
      ch[(long)iVar13 + -1] = (fVar18 + fVar21) - (fVar14 + fVar15);
      lVar4 = (long)(iVar12 + ido * 2);
      ch[lVar4 + -1] = cc[iVar10] - pfVar2[iVar3 * 2];
      ch[lVar4] = pfVar2[iVar3 * 3] - pfVar2[iVar3];
      iVar10 = iVar10 + ido;
      pfVar2 = pfVar2 + ido;
      iVar7 = iVar7 + -1;
      iVar12 = iVar13;
    } while (iVar7 != 0);
  }
  if (1 < ido) {
    if (ido != 2) {
      if (0 < l1) {
        iVar12 = ido * 2;
        uVar1 = (ulong)(uint)ido;
        lVar4 = (long)iVar3;
        pfVar2 = cc + lVar4;
        pfVar11 = cc + lVar4 * 3;
        pfVar9 = cc + lVar4 * 2;
        iVar10 = 0;
        local_80 = 0;
        pfVar5 = cc;
        iVar7 = iVar12;
        do {
          pfVar6 = ch + (long)iVar7 + -3;
          lVar4 = (long)iVar10;
          uVar8 = 2;
          do {
            fVar14 = wa3[uVar8 - 2] * pfVar11[uVar8 - 1] + wa3[uVar8 - 1] * pfVar11[uVar8];
            fVar15 = wa3[uVar8 - 2] * pfVar11[uVar8] - pfVar11[uVar8 - 1] * wa3[uVar8 - 1];
            fVar21 = pfVar9[uVar8 - 1] * wa2[uVar8 - 2] + pfVar9[uVar8] * wa2[uVar8 - 1];
            fVar22 = pfVar2[uVar8] * wa1[uVar8 - 2] + -wa1[uVar8 - 1] * pfVar2[uVar8 - 1];
            fVar17 = pfVar2[uVar8 - 1] * wa1[uVar8 - 2] + pfVar2[uVar8] * wa1[uVar8 - 1];
            fVar18 = pfVar9[uVar8] * wa2[uVar8 - 2] + -wa2[uVar8 - 1] * pfVar9[uVar8 - 1];
            fVar16 = fVar14 - fVar17;
            fVar19 = pfVar5[uVar8 - 1] + fVar21;
            fVar20 = fVar15 + fVar22;
            fVar21 = pfVar5[uVar8 - 1] - fVar21;
            fVar22 = fVar22 - fVar15;
            fVar14 = fVar14 + fVar17;
            fVar15 = pfVar5[uVar8] + fVar18;
            fVar18 = pfVar5[uVar8] - fVar18;
            *(ulong *)(ch + lVar4 + (uVar8 - 1)) = CONCAT44(fVar20 + fVar15,fVar19 + fVar14);
            *pfVar6 = fVar21 - fVar22;
            pfVar6[1] = fVar16 - fVar18;
            ch[(long)iVar12 + lVar4 + (uVar8 - 1)] = fVar21 + fVar22;
            ch[(long)iVar12 + lVar4 + uVar8] = fVar18 + fVar16;
            *(ulong *)(pfVar6 + iVar12) = CONCAT44(fVar20 - fVar15,fVar19 - fVar14);
            uVar8 = uVar8 + 2;
            pfVar6 = pfVar6 + -2;
          } while (uVar8 < uVar1);
          local_80 = local_80 + 1;
          iVar10 = iVar10 + ido * 4;
          iVar7 = iVar7 + ido * 4;
          pfVar5 = pfVar5 + uVar1;
          pfVar2 = pfVar2 + uVar1;
          pfVar11 = pfVar11 + uVar1;
          pfVar9 = pfVar9 + uVar1;
        } while (local_80 != l1);
      }
      if ((ido & 1U) != 0) {
        return;
      }
    }
    if (0 < l1) {
      lVar4 = (long)(ido + iVar3 + -1);
      pfVar2 = ch + (uint)ido;
      do {
        fVar15 = (cc[lVar4] + cc[iVar3 * 3 + -1 + ido]) * -0.70710677;
        fVar14 = (cc[lVar4] - cc[iVar3 * 3 + -1 + ido]) * 0.70710677;
        pfVar2[-1] = cc[(ulong)(uint)ido - 1] + fVar14;
        pfVar2[(long)(ido * 2) + -1] = cc[(ulong)(uint)ido - 1] - fVar14;
        *pfVar2 = fVar15 - cc[iVar3 + lVar4];
        pfVar11 = cc + iVar3 + lVar4;
        cc = cc + (uint)ido;
        pfVar2[ido * 2] = fVar15 + *pfVar11;
        pfVar2 = pfVar2 + ido * 4;
        l1 = l1 + -1;
      } while (l1 != 0);
    }
  }
  return;
}

Assistant:

static void dradf4(int ido,int l1,float *cc,float *ch,float *wa1,
            float *wa2,float *wa3){
  static float hsqt2 = .70710678118654752f;
  int i,k,t0,t1,t2,t3,t4,t5,t6;
  float ci2,ci3,ci4,cr2,cr3,cr4,ti1,ti2,ti3,ti4,tr1,tr2,tr3,tr4;
  t0=l1*ido;

  t1=t0;
  t4=t1<<1;
  t2=t1+(t1<<1);
  t3=0;

  for(k=0;k<l1;k++){
    tr1=cc[t1]+cc[t2];
    tr2=cc[t3]+cc[t4];

    ch[t5=t3<<2]=tr1+tr2;
    ch[(ido<<2)+t5-1]=tr2-tr1;
    ch[(t5+=(ido<<1))-1]=cc[t3]-cc[t4];
    ch[t5]=cc[t2]-cc[t1];

    t1+=ido;
    t2+=ido;
    t3+=ido;
    t4+=ido;
  }

  if(ido<2)return;
  if(ido==2)goto L105;


  t1=0;
  for(k=0;k<l1;k++){
    t2=t1;
    t4=t1<<2;
    t5=(t6=ido<<1)+t4;
    for(i=2;i<ido;i+=2){
      t3=(t2+=2);
      t4+=2;
      t5-=2;

      t3+=t0;
      cr2=wa1[i-2]*cc[t3-1]+wa1[i-1]*cc[t3];
      ci2=wa1[i-2]*cc[t3]-wa1[i-1]*cc[t3-1];
      t3+=t0;
      cr3=wa2[i-2]*cc[t3-1]+wa2[i-1]*cc[t3];
      ci3=wa2[i-2]*cc[t3]-wa2[i-1]*cc[t3-1];
      t3+=t0;
      cr4=wa3[i-2]*cc[t3-1]+wa3[i-1]*cc[t3];
      ci4=wa3[i-2]*cc[t3]-wa3[i-1]*cc[t3-1];

      tr1=cr2+cr4;
      tr4=cr4-cr2;
      ti1=ci2+ci4;
      ti4=ci2-ci4;

      ti2=cc[t2]+ci3;
      ti3=cc[t2]-ci3;
      tr2=cc[t2-1]+cr3;
      tr3=cc[t2-1]-cr3;

      ch[t4-1]=tr1+tr2;
      ch[t4]=ti1+ti2;

      ch[t5-1]=tr3-ti4;
      ch[t5]=tr4-ti3;

      ch[t4+t6-1]=ti4+tr3;
      ch[t4+t6]=tr4+ti3;

      ch[t5+t6-1]=tr2-tr1;
      ch[t5+t6]=ti1-ti2;
    }
    t1+=ido;
  }
  if(ido&1)return;

 L105:

  t2=(t1=t0+ido-1)+(t0<<1);
  t3=ido<<2;
  t4=ido;
  t5=ido<<1;
  t6=ido;

  for(k=0;k<l1;k++){
    ti1=-hsqt2*(cc[t1]+cc[t2]);
    tr1=hsqt2*(cc[t1]-cc[t2]);

    ch[t4-1]=tr1+cc[t6-1];
    ch[t4+t5-1]=cc[t6-1]-tr1;

    ch[t4]=ti1-cc[t1+t0];
    ch[t4+t5]=ti1+cc[t1+t0];

    t1+=ido;
    t2+=ido;
    t4+=t3;
    t6+=ido;
  }
}